

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void pmovsxbw_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  UInt8 UVar2;
  Int32 IVar3;
  OPTYPE *pMyOperand;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    UVar1 = (pMyDisasm->Reserved_).VEX.pp;
    if (UVar1 == '\x02') {
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpmovswb",9);
      UVar1 = (pMyDisasm->Reserved_).EVEX.state;
      if (UVar1 == '\x01') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\f';
      }
      UVar2 = (pMyDisasm->Reserved_).VEX.L;
      if (UVar2 == '\x01') {
        (pMyDisasm->Instruction).Category = (uint)(UVar1 == '\x01') * 0x20000 + 0x120000;
        (pMyDisasm->Reserved_).MemDecoration = 9;
        (pMyDisasm->Reserved_).Register_ = 4;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Reserved_).Register_ = 8;
      }
      else if (UVar2 == '\0') {
        IVar3 = 0x110000;
        if (UVar1 == '\x01') {
          IVar3 = 0x140000;
        }
        (pMyDisasm->Instruction).Category = IVar3;
        (pMyDisasm->Reserved_).Register_ = 4;
        (pMyDisasm->Reserved_).MemDecoration = 4;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
      }
      else {
        if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') {
          return;
        }
        (pMyDisasm->Instruction).Category = 0x140000;
        (pMyDisasm->Reserved_).MemDecoration = 10;
        (pMyDisasm->Reserved_).Register_ = 8;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Reserved_).Register_ = 0x10;
      }
      pMyOperand = &pMyDisasm->Operand2;
      goto LAB_0012b79c;
    }
    if (UVar1 != '\x01') goto LAB_0012b5c5;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpmovsxbw",10);
    UVar1 = (pMyDisasm->Reserved_).EVEX.state;
    if (UVar1 == '\x01') {
      (pMyDisasm->Reserved_).EVEX.tupletype = '\f';
    }
    UVar2 = (pMyDisasm->Reserved_).VEX.L;
    if (UVar2 == '\x01') {
      (pMyDisasm->Instruction).Category = (uint)(UVar1 == '\x01') * 0x20000 + 0x120000;
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Reserved_).Register_ = 4;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).Register_ = 8;
    }
    else {
      if (UVar2 == '\0') {
        IVar3 = 0x110000;
        if (UVar1 == '\x01') {
          IVar3 = 0x140000;
        }
        (pMyDisasm->Instruction).Category = IVar3;
        (pMyDisasm->Reserved_).Register_ = 4;
        (pMyDisasm->Reserved_).MemDecoration = 0x68;
        goto LAB_0012b5aa;
      }
      if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') {
        return;
      }
      (pMyDisasm->Instruction).Category = 0x140000;
      (pMyDisasm->Reserved_).MemDecoration = 0x6e;
      (pMyDisasm->Reserved_).Register_ = 8;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).Register_ = 0x10;
    }
  }
  else {
    if ((pMyDisasm->Prefix).OperandSize != '\x01') {
LAB_0012b5c5:
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
      (pMyDisasm->Operand1).AccessMode = 0;
      (pMyDisasm->Operand2).AccessMode = 0;
      (pMyDisasm->Operand3).AccessMode = 0;
      (pMyDisasm->Operand4).AccessMode = 0;
      (pMyDisasm->Operand5).AccessMode = 0;
      (pMyDisasm->Operand6).AccessMode = 0;
      (pMyDisasm->Operand7).AccessMode = 0;
      (pMyDisasm->Operand8).AccessMode = 0;
      (pMyDisasm->Operand9).AccessMode = 0;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
      return;
    }
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
    (pMyDisasm->Instruction).Category = 0x80014;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"pmovsxbw",9);
    (pMyDisasm->Reserved_).Register_ = 4;
LAB_0012b5aa:
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
  }
  pMyOperand = &pMyDisasm->Operand1;
LAB_0012b79c:
  decodeRegOpcode(pMyOperand,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ pmovsxbw_(PDISASM pMyDisasm)
{
 if (GV.VEX.state == InUsePrefix) {
   if (GV.VEX.pp == 0x1) {
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpmovsxbw");
     #endif
     if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = HALF_MEM;
     if (GV.VEX.L == 0) {
       pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
       GV.Register_ = SSE_REG;
       GV.MemDecoration = Arg2qword;
       GxEx(pMyDisasm);
     }
     else if (GV.VEX.L == 0x1) {
       pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX2_INSTRUCTION;
       GV.MemDecoration = Arg2_m128_xmm;
       GV.Register_ = SSE_REG;
       decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
       GV.Register_ = AVX_REG;
       decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
       GV.EIP_ += GV.DECALAGE_EIP+2;
     }
     else if (GV.EVEX.LL == 0x2) {
       pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
       GV.MemDecoration = Arg2_m256_ymm;
       GV.Register_ = AVX_REG;
       decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
       GV.Register_ = AVX512_REG;
       decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
       GV.EIP_ += GV.DECALAGE_EIP+2;
     }
   }
   else if (GV.VEX.pp == 0x2) {
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpmovswb");
     #endif
     if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = HALF_MEM;
     if (GV.VEX.L == 0) {
       pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
       GV.Register_ = SSE_REG;
       GV.MemDecoration = Arg1qword;
       ExGx(pMyDisasm);
     }
     else if (GV.VEX.L == 0x1) {
       pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX2_INSTRUCTION;
       GV.MemDecoration = Arg1_m128_xmm;
       GV.Register_ = SSE_REG;
       decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
       GV.Register_ = AVX_REG;
       decodeRegOpcode(&pMyDisasm->Operand2, pMyDisasm);
       GV.EIP_ += GV.DECALAGE_EIP+2;
     }
     else if (GV.EVEX.LL == 0x2) {
       pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
       GV.MemDecoration = Arg1_m256_ymm;
       GV.Register_ = AVX_REG;
       decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
       GV.Register_ = AVX512_REG;
       decodeRegOpcode(&pMyDisasm->Operand2, pMyDisasm);
       GV.EIP_ += GV.DECALAGE_EIP+2;
     }
   }
   else {
     failDecode(pMyDisasm);
   }

 }
 else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
   GV.OperandSize = GV.OriginalOperandSize;
   pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
   GV.MemDecoration = Arg2qword;
   pMyDisasm->Instruction.Category = SSE41_INSTRUCTION+CONVERSION_INSTRUCTION;
   #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pmovsxbw");
   #endif
   GV.Register_ = SSE_REG;
   GxEx(pMyDisasm);

 }
 else {
   failDecode(pMyDisasm);
 }
}